

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void virtual_do_end(dill_stream s,int package)

{
  dill_stream pdVar1;
  uint uVar2;
  dill_stream c;
  char *pcVar3;
  label_translation_table __ptr;
  int in_ESI;
  dill_stream in_RDI;
  dill_exec_handle h;
  void *in_stack_00000008;
  int virtual_local_pointer;
  label_translation_table ltable;
  void *prefix_begin;
  void *code_end;
  void *insns;
  virtual_mach_info vmi;
  virtual_mach_info in_stack_00000108;
  label_translation_table in_stack_00000110;
  void *in_stack_00000118;
  dill_stream in_stack_00000120;
  virtual_mach_info in_stack_00000248;
  label_translation_table in_stack_00000250;
  void *in_stack_00000258;
  dill_stream in_stack_00000260;
  label_translation_table in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  virtual_insn *in_stack_ffffffffffffffc8;
  dill_stream c_00;
  undefined8 *puVar5;
  int vlp;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar5 = (undefined8 *)in_RDI->p->mach_info;
  c_00 = (dill_stream)in_RDI->p->code_base;
  pdVar1 = (dill_stream)in_RDI->p->cur_ip;
  c = (dill_stream)((long)c_00 + (long)*(int *)(puVar5 + 3) * 0x28);
  iVar4 = in_RDI->dill_local_pointer;
  if (virtual_do_end::dill_verbose == -1) {
    pcVar3 = getenv("DILL_VERBOSE");
    virtual_do_end::dill_verbose = (int)(pcVar3 != (char *)0x0);
    pcVar3 = getenv("DILL_NOOPTIMIZE");
    virtual_do_end::no_optimize = (int)(pcVar3 != (char *)0x0);
    pcVar3 = getenv("DILL_OLD_REGS");
    virtual_do_end::old_reg_alloc = (int)(pcVar3 != (char *)0x0);
    pcVar3 = getenv("DILL_DO_EMULATION");
    virtual_do_end::do_emulation = (int)(pcVar3 != (char *)0x0);
  }
  (in_RDI->p->virtual).code_base = in_RDI->p->code_base;
  if (*(int *)(puVar5 + 3) == -1) {
    c = pdVar1;
  }
  build_bbs((dill_stream)ltable,in_stack_00000008,h,in_RDI);
  if (virtual_do_end::no_optimize == 0) {
    if (count_verbose == -1) {
      pcVar3 = getenv("DILL_COUNTS");
      count_verbose = (int)(pcVar3 != (char *)0x0);
    }
    if (count_verbose == 1) {
      uVar2 = virtual_insn_count(in_RDI);
      printf("Prior to optimization, %d non-null virtual insns\n",(ulong)uVar2);
    }
    const_propagation((dill_stream)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,(virtual_mach_info)0x114a51);
    if (count_verbose == 1) {
      uVar2 = virtual_insn_count(in_RDI);
      printf("After constant propagation, %d non-null virtual insns\n",(ulong)uVar2);
    }
    CSE_elimination((dill_stream)CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
                    ,(virtual_mach_info)0x114a88);
    if (count_verbose == 1) {
      uVar2 = virtual_insn_count(in_RDI);
      printf("After duplicate instruction elimination (CSE-lite), %d non-null virtual insns\n",
             (ulong)uVar2);
    }
    reset_use_def_count(c,in_stack_ffffffffffffffc8,
                        (virtual_mach_info)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    kill_dead_regs(c,in_stack_ffffffffffffffc8,
                   (virtual_mach_info)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
  }
  if (virtual_do_end::dill_verbose != 0) {
    dump_bbs((dill_stream)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    in_RDI->dill_debug = 1;
  }
  (in_RDI->p->virtual).mach_jump = in_RDI->j;
  (in_RDI->p->virtual).mach_reset = in_RDI->p->mach_reset;
  (in_RDI->p->virtual).mach_info = in_RDI->p->mach_info;
  (in_RDI->p->virtual).code_base = in_RDI->p->code_base;
  (in_RDI->p->virtual).cur_ip = in_RDI->p->cur_ip;
  (in_RDI->p->virtual).code_limit = in_RDI->p->code_limit;
  if (virtual_do_end::do_emulation == 0) {
    if (dill_foreign_cg == (dill_foreign_cg_func)0x0) {
      in_RDI->j = (in_RDI->p->native).mach_jump;
      in_RDI->p->mach_reset = (in_RDI->p->native).mach_reset;
      in_RDI->p->mach_info = (in_RDI->p->native).mach_info;
      in_RDI->p->code_base = (in_RDI->p->native).code_base;
      (in_RDI->p->native).code_base = (char *)0x0;
      (in_RDI->p->native).mach_info = (void *)0x0;
      if (in_RDI->p->code_base == (char *)0x0) {
        init_code_block((dill_stream_conflict)0x114cba);
        (in_RDI->p->native).code_base = in_RDI->p->code_base;
        (in_RDI->p->native).code_limit = in_RDI->p->code_limit;
      }
      in_RDI->p->cur_ip = in_RDI->p->code_base;
      in_RDI->p->code_limit = (in_RDI->p->native).code_limit;
      (*in_RDI->p->native_mach_reset)(in_RDI);
      __ptr = build_label_translation(c_00);
      (*in_RDI->j->proc_start)
                (in_RDI,"no name",in_RDI->p->c_param_count,(void *)*puVar5,(dill_reg *)0x0);
      vlp = (int)((ulong)puVar5 >> 0x20);
      fill_label_translation
                ((dill_stream)CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      if (virtual_do_end::old_reg_alloc == 0) {
        new_emit_insns(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
      }
      else {
        do_register_assign((dill_stream)h,in_RDI,(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           vlp,(virtual_mach_info)c_00);
        emit_insns(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
      }
      free_bbs((virtual_mach_info)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
      free(__ptr);
      if (in_ESI == 0) {
        dill_finalize((dill_stream_conflict)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
        dill_free_handle((dill_exec_handle)0x114e33);
      }
      else {
        (*in_RDI->j->package_end)(in_RDI);
      }
      in_RDI->j = (in_RDI->p->native).mach_jump;
      (in_RDI->p->native).mach_reset = in_RDI->p->mach_reset;
      (in_RDI->p->native).mach_info = in_RDI->p->mach_info;
      (in_RDI->p->native).code_base = in_RDI->p->code_base;
      (in_RDI->p->native).cur_ip = in_RDI->p->cur_ip;
      (in_RDI->p->native).code_limit = in_RDI->p->code_limit;
      if (in_ESI == 0) {
        in_RDI->p->code_base = (char *)0x0;
      }
      in_RDI->p->mach_info = (void *)0x0;
      in_RDI->p->mach_reset = dill_virtual_init;
    }
    else {
      (*dill_foreign_cg)(in_RDI,(virtual_insn *)in_RDI->p->code_base,
                         (virtual_insn *)in_RDI->p->cur_ip);
    }
  }
  else {
    free_bbs((virtual_mach_info)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
    in_RDI->p->mach_reset = dill_virtual_init;
  }
  if (virtual_do_end::dill_verbose != 0) {
    dill_dump((dill_stream_conflict)h);
  }
  return;
}

Assistant:

static void
virtual_do_end(dill_stream s, int package)
{
    static int no_optimize = -1;
    static int dill_verbose = -1;
    static int old_reg_alloc = -1;
    static int do_emulation = -1;

    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    void* insns = s->p->code_base;
    void* code_end = s->p->cur_ip;
    void* prefix_begin =
        (char*)insns + (vmi->prefix_code_start * sizeof(virtual_insn));
    ;
    label_translation_table ltable;
    int virtual_local_pointer = s->dill_local_pointer;

    if (dill_verbose == -1) {
        dill_verbose = (getenv("DILL_VERBOSE") != NULL);
        no_optimize = (getenv("DILL_NOOPTIMIZE") != NULL);
        old_reg_alloc = (getenv("DILL_OLD_REGS") != NULL);
        do_emulation = (getenv("DILL_DO_EMULATION") != NULL);
#ifdef EMULATION_ONLY
        do_emulation = 1;
#endif
    }
    s->p->virtual.code_base = s->p->code_base;
    if (vmi->prefix_code_start == -1)
        prefix_begin = code_end;
    build_bbs(s, insns, prefix_begin, code_end);

    if (!no_optimize) {
        if (count_verbose == -1) {
            count_verbose = (getenv("DILL_COUNTS") != NULL);
        }
        if (count_verbose == 1) {
            printf("Prior to optimization, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        const_propagation(s, insns, vmi);
        if (count_verbose == 1) {
            printf("After constant propagation, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        CSE_elimination(s, insns, vmi);
        if (count_verbose == 1) {
            printf(
                "After duplicate instruction elimination (CSE-lite), %d "
                "non-null virtual insns\n",
                virtual_insn_count(s));
        }
        reset_use_def_count(s, insns, vmi);
        kill_dead_regs(s, insns, vmi);
    }

    if (dill_verbose) {
        dump_bbs(s);
        s->dill_debug = 1;
    }
    s->p->virtual.mach_jump = s->j;
    s->p->virtual.mach_reset = s->p->mach_reset;
    s->p->virtual.mach_info = s->p->mach_info;
    s->p->virtual.code_base = s->p->code_base;
    s->p->virtual.cur_ip = s->p->cur_ip;
    s->p->virtual.code_limit = s->p->code_limit;

    if (do_emulation) {
#ifdef BUILD_EMULATOR
        /* do a return, just in case it's missing */
        if (vmi->prefix_code_start == -1) {
            dill_retii(s, 0);
            s->p->virtual.cur_ip = s->p->cur_ip;
	    s->p->virtual.code_base = s->p->code_base;
	    s->p->virtual.code_limit = s->p->code_limit;
        }
        setup_VM_proc(s);
#endif
        free_bbs(vmi);
        s->p->mach_reset = dill_virtual_init;
    } else if (dill_foreign_cg) {
        (dill_foreign_cg)(s, (virtual_insn*)s->p->code_base,
                          (virtual_insn*)s->p->cur_ip);
    } else {
        s->j = s->p->native.mach_jump;
        s->p->mach_reset = s->p->native.mach_reset;
        s->p->mach_info = s->p->native.mach_info;
        s->p->code_base = s->p->native.code_base;
        s->p->native.code_base = NULL;
        s->p->native.mach_info = NULL;
        if (s->p->code_base == NULL) {
            init_code_block(s);
            s->p->native.code_base = s->p->code_base;
            s->p->native.code_limit = s->p->code_limit;
        }
        s->p->cur_ip = s->p->code_base;
        s->p->code_limit = s->p->native.code_limit;

        s->p->native_mach_reset(s);
        ltable = build_label_translation(s);
        (s->j->proc_start)(s, "no name", s->p->c_param_count, vmi->arg_info,
                           (void*)0);
        fill_label_translation(s, ltable);
        if (old_reg_alloc) {
            do_register_assign(s, insns, code_end, virtual_local_pointer, vmi);
            emit_insns(s, insns, ltable, vmi);
        } else {
            new_emit_insns(s, insns, ltable, vmi);
        }
        free_bbs(vmi);
        free(ltable);
        if (package) {
            s->j->package_end(s);
        } else {
            dill_exec_handle h;
            h = dill_finalize(s);
            dill_free_handle(h);
        }
        s->j = s->p->native.mach_jump;
        s->p->native.mach_reset = s->p->mach_reset;
        s->p->native.mach_info = s->p->mach_info;
        s->p->native.code_base = s->p->code_base;
        s->p->native.cur_ip = s->p->cur_ip;
        s->p->native.code_limit = s->p->code_limit;
        if (!package)
            s->p->code_base = NULL;
        s->p->mach_info = NULL;
        s->p->mach_reset = dill_virtual_init;
    }
    if (dill_verbose) {
        dill_dump(s);
    }
}